

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void init_functions(void)

{
  DFsScript *this;
  int iVar1;
  PClassActor *pPVar2;
  DFsVariable *pDVar3;
  FLineSpecial *pFVar4;
  FLineSpecial *ls;
  int i_1;
  int max;
  DFsScript *gscr;
  uint i;
  
  for (gscr._4_4_ = 0; this = global_script, gscr._4_4_ < 0x8b; gscr._4_4_ = gscr._4_4_ + 1) {
    pPVar2 = PClass::FindActor(ActorNames_init[gscr._4_4_]);
    ActorTypes[gscr._4_4_] = pPVar2;
  }
  pDVar3 = DFsScript::NewVariable(global_script,"consoleplayer",7);
  (pDVar3->value).pI = &consoleplayer;
  pDVar3 = DFsScript::NewVariable(this,"displayplayer",7);
  (pDVar3->value).pI = &consoleplayer;
  pDVar3 = DFsScript::NewVariable(this,"zoom",7);
  (pDVar3->value).pI = &zoom;
  pDVar3 = DFsScript::NewVariable(this,"fov",7);
  (pDVar3->value).pI = &zoom;
  pDVar3 = DFsScript::NewVariable(this,"trigger",8);
  (pDVar3->value).pI = (int *)&trigger_obj;
  iVar1 = P_GetMaxLineSpecial();
  for (ls._0_4_ = 0; (int)ls <= iVar1; ls._0_4_ = (int)ls + 1) {
    pFVar4 = P_GetLineSpecialInfo((int)ls);
    if ((pFVar4 != (FLineSpecial *)0x0) && (-1 < pFVar4->max_args)) {
      pDVar3 = DFsScript::NewVariable(this,pFVar4->name,9);
      (pDVar3->value).ls = pFVar4;
    }
  }
  DFsScript::NewFunction(this,"break",0x8ec680);
  DFsScript::NewFunction(this,"continue",0x8ec620);
  DFsScript::NewFunction(this,"return",0x8ec750);
  DFsScript::NewFunction(this,"goto",0x8ec6e0);
  DFsScript::NewFunction(this,"include",0x8ec790);
  DFsScript::NewFunction(this,"print",0x8ec480);
  DFsScript::NewFunction(this,"rnd",0x8ec500);
  DFsScript::NewFunction(this,"prnd",0x8ec500);
  DFsScript::NewFunction(this,"input",0x8ec840);
  DFsScript::NewFunction(this,"beep",0x8ec870);
  DFsScript::NewFunction(this,"clock",0x8ec8b0);
  DFsScript::NewFunction(this,"wait",0x8f41e0);
  DFsScript::NewFunction(this,"tagwait",0x8f4290);
  DFsScript::NewFunction(this,"scriptwait",0x8f4330);
  DFsScript::NewFunction(this,"startscript",0x8f4470);
  DFsScript::NewFunction(this,"scriptrunning",0x8f45c0);
  DFsScript::NewFunction(this,"startskill",0x8efae0);
  DFsScript::NewFunction(this,"exitlevel",0x8ec8f0);
  DFsScript::NewFunction(this,"tip",0x8ec910);
  DFsScript::NewFunction(this,"timedtip",0x8ec9f0);
  DFsScript::NewFunction(this,"message",0x8ecc90);
  DFsScript::NewFunction(this,"gameskill",0x8f05f0);
  DFsScript::NewFunction(this,"gamemode",0x8f0630);
  DFsScript::NewFunction(this,"playermsg",0x8ecd70);
  DFsScript::NewFunction(this,"playertip",0x8ecae0);
  DFsScript::NewFunction(this,"playeringame",0x8ece60);
  DFsScript::NewFunction(this,"playername",0x8eced0);
  DFsScript::NewFunction(this,"playeraddfrag",0x8f29e0);
  DFsScript::NewFunction(this,"playerobj",0x8ecfe0);
  DFsScript::NewFunction(this,"isplayerobj",0x8f06b0);
  DFsScript::NewFunction(this,"isobjplayer",0x8f06b0);
  DFsScript::NewFunction(this,"skincolor",0x8f2b20);
  DFsScript::NewFunction(this,"playerkeys",0x8f0750);
  DFsScript::NewFunction(this,"playerammo",0x8f0ae0);
  DFsScript::NewFunction(this,"maxplayerammo",0x8f0d10);
  DFsScript::NewFunction(this,"playerweapon",0x8f0f60);
  DFsScript::NewFunction(this,"playerselwep",0x8f1230);
  DFsScript::NewFunction(this,"spawn",0x8ed190);
  DFsScript::NewFunction(this,"spawnexplosion",0x8f1db0);
  DFsScript::NewFunction(this,"radiusattack",0x8f2030);
  DFsScript::NewFunction(this,"kill",0x8ed550);
  DFsScript::NewFunction(this,"removeobj",0x8ed4f0);
  DFsScript::NewFunction(this,"objx",0x8ed650);
  DFsScript::NewFunction(this,"objy",0x8ed6f0);
  DFsScript::NewFunction(this,"objz",0x8ed790);
  DFsScript::NewFunction(this,"testlocation",0x8f2220);
  DFsScript::NewFunction(this,"teleport",0x8ed8d0);
  DFsScript::NewFunction(this,"silentteleport",0x8ed990);
  DFsScript::NewFunction(this,"damageobj",0x8eda50);
  DFsScript::NewFunction(this,"healobj",0x8f22b0);
  DFsScript::NewFunction(this,"player",0x8ed0d0);
  DFsScript::NewFunction(this,"objsector",0x8edb60);
  DFsScript::NewFunction(this,"objflag",0x8edc90);
  DFsScript::NewFunction(this,"pushobj",0x8ede80);
  DFsScript::NewFunction(this,"pushthing",0x8ede80);
  DFsScript::NewFunction(this,"objangle",0x8ed830);
  DFsScript::NewFunction(this,"objhealth",0x8edc00);
  DFsScript::NewFunction(this,"objdead",0x8f23d0);
  DFsScript::NewFunction(this,"reactiontime",0x8edf30);
  DFsScript::NewFunction(this,"objreactiontime",0x8edf30);
  DFsScript::NewFunction(this,"objtarget",0x8edff0);
  DFsScript::NewFunction(this,"objmomx",0x8ee110);
  DFsScript::NewFunction(this,"objmomy",0x8ee1d0);
  DFsScript::NewFunction(this,"objmomz",0x8ee290);
  DFsScript::NewFunction(this,"spawnmissile",0x8f24b0);
  DFsScript::NewFunction(this,"mapthings",0x8f26f0);
  DFsScript::NewFunction(this,"objtype",0x8f2db0);
  DFsScript::NewFunction(this,"mapthingnumexist",0x8f25b0);
  DFsScript::NewFunction(this,"objstate",0x8f2750);
  DFsScript::NewFunction(this,"resurrect",0x8f2b50);
  DFsScript::NewFunction(this,"lineattack",0x8f2c30);
  DFsScript::NewFunction(this,"setobjposition",0x8f2110);
  DFsScript::NewFunction(this,"floorheight",0x8eea90);
  DFsScript::NewFunction(this,"floortext",0x8ef730);
  DFsScript::NewFunction(this,"floortexture",0x8ef730);
  DFsScript::NewFunction(this,"movefloor",0x8eed20);
  DFsScript::NewFunction(this,"ceilheight",0x8eee70);
  DFsScript::NewFunction(this,"ceilingheight",0x8eee70);
  DFsScript::NewFunction(this,"moveceil",0x8ef100);
  DFsScript::NewFunction(this,"moveceiling",0x8ef100);
  DFsScript::NewFunction(this,"ceilingtexture",0x8ef900);
  DFsScript::NewFunction(this,"ceiltext",0x8ef900);
  DFsScript::NewFunction(this,"lightlevel",0x8ef2a0);
  DFsScript::NewFunction(this,"fadelight",0x8ef5e0);
  DFsScript::NewFunction(this,"colormap",0x8ef8f0);
  DFsScript::NewFunction(this,"setcamera",0x8ee510);
  DFsScript::NewFunction(this,"clearcamera",0x8ee750);
  DFsScript::NewFunction(this,"movecamera",0x8f17a0);
  DFsScript::NewFunction(this,"pointtoangle",0x8ee350);
  DFsScript::NewFunction(this,"pointtodist",0x8ee430);
  DFsScript::NewFunction(this,"startsound",0x8ee810);
  DFsScript::NewFunction(this,"startsectorsound",0x8ee9c0);
  DFsScript::NewFunction(this,"ambientsound",0x8f1ba0);
  DFsScript::NewFunction(this,"startambiantsound",0x8f1ba0);
  DFsScript::NewFunction(this,"changemusic",0x8eff80);
  DFsScript::NewFunction(this,"changehublevel",0x8efac0);
  DFsScript::NewFunction(this,"opendoor",0x8efb00);
  DFsScript::NewFunction(this,"closedoor",0x8efc20);
  DFsScript::NewFunction(this,"newhupic",0x8f32c0);
  DFsScript::NewFunction(this,"createpic",0x8f32c0);
  DFsScript::NewFunction(this,"deletehupic",0x8f3370);
  DFsScript::NewFunction(this,"modifyhupic",0x8f33e0);
  DFsScript::NewFunction(this,"modifypic",0x8f33e0);
  DFsScript::NewFunction(this,"sethupicdisplay",0x8f34c0);
  DFsScript::NewFunction(this,"setpicvisible",0x8f34c0);
  DFsScript::NewFunction(this,"playdemo",0x8f2b30);
  DFsScript::NewFunction(this,"runcommand",0x8efcf0);
  DFsScript::NewFunction(this,"checkcvar",0x8f2b40);
  DFsScript::NewFunction(this,"setlinetexture",0x8f0180);
  DFsScript::NewFunction(this,"linetrigger",0x8efd60);
  DFsScript::NewFunction(this,"lineflag",0x8f2890);
  DFsScript::NewFunction(this,"max",0x8f0460);
  DFsScript::NewFunction(this,"min",0x8f04f0);
  DFsScript::NewFunction(this,"abs",0x8f0580);
  DFsScript::NewFunction(this,"sin",0x8f2e80);
  DFsScript::NewFunction(this,"asin",0x8f2ee0);
  DFsScript::NewFunction(this,"cos",0x8f2f40);
  DFsScript::NewFunction(this,"acos",0x8f2fa0);
  DFsScript::NewFunction(this,"tan",0x8f3000);
  DFsScript::NewFunction(this,"atan",0x8f3060);
  DFsScript::NewFunction(this,"exp",0x8f30c0);
  DFsScript::NewFunction(this,"log",0x8f3120);
  DFsScript::NewFunction(this,"sqrt",0x8f3180);
  DFsScript::NewFunction(this,"floor",0x8f31e0);
  DFsScript::NewFunction(this,"pow",0x8f3240);
  DFsScript::NewFunction(this,"setlineblocking",0x8effd0);
  DFsScript::NewFunction(this,"setlinetrigger",0x8f3eb0);
  DFsScript::NewFunction(this,"setlinemnblock",0x8f00b0);
  DFsScript::NewFunction(this,"scriptwaitpre",0x8f43d0);
  DFsScript::NewFunction(this,"exitsecret",0x8f1c00);
  DFsScript::NewFunction(this,"objawaken",0x8f1b10);
  DFsScript::NewFunction(this,"mobjvalue",0x8f1c20);
  DFsScript::NewFunction(this,"stringvalue",0x8f1c80);
  DFsScript::NewFunction(this,"intvalue",0x8f1d10);
  DFsScript::NewFunction(this,"fixedvalue",0x8f1d60);
  DFsScript::NewFunction(this,"spawnshot2",0x8f3b50);
  DFsScript::NewFunction(this,"setcolor",0x8f39c0);
  DFsScript::NewFunction(this,"objradius",0x8f3640);
  DFsScript::NewFunction(this,"objheight",0x8f3700);
  DFsScript::NewFunction(this,"thingcount",0x8f37c0);
  DFsScript::NewFunction(this,"killinsector",0x8f3da0);
  DFsScript::NewFunction(this,"levelnum",0x8f3610);
  DFsScript::NewFunction(this,"giveinventory",0x8f13d0);
  DFsScript::NewFunction(this,"takeinventory",0x8f14a0);
  DFsScript::NewFunction(this,"checkinventory",0x8f1570);
  DFsScript::NewFunction(this,"setweapon",0x8f1620);
  DFsScript::NewFunction(this,"setcorona",0x8f3570);
  return;
}

Assistant:

void init_functions(void)
{
	for(unsigned i=0;i<countof(ActorNames_init);i++)
	{
		ActorTypes[i]=PClass::FindActor(ActorNames_init[i]);
	}

	DFsScript * gscr = global_script;

	// add all the functions
	gscr->NewVariable("consoleplayer", svt_pInt)->value.pI = &consoleplayer;
	gscr->NewVariable("displayplayer", svt_pInt)->value.pI = &consoleplayer;
	gscr->NewVariable("zoom", svt_pInt)->value.pI = &zoom;
	gscr->NewVariable("fov", svt_pInt)->value.pI = &zoom;
	gscr->NewVariable("trigger", svt_pMobj)->value.pMobj = &trigger_obj;

	// Create constants for all existing line specials
	int max = P_GetMaxLineSpecial();
	for(int i=0; i<=max; i++)
	{
		const FLineSpecial *ls = P_GetLineSpecialInfo(i);

		if (ls != NULL && ls->max_args >= 0)	// specials with max args set to -1 can only be used in a map and are of no use hee.
		{
			gscr->NewVariable(ls->name, svt_linespec)->value.ls = ls;
		}
	}
	
	// important C-emulating stuff
	gscr->NewFunction("break", &FParser::SF_Break);
	gscr->NewFunction("continue", &FParser::SF_Continue);
	gscr->NewFunction("return", &FParser::SF_Return);
	gscr->NewFunction("goto", &FParser::SF_Goto);
	gscr->NewFunction("include", &FParser::SF_Include);
	
	// standard FraggleScript functions
	gscr->NewFunction("print", &FParser::SF_Print);
	gscr->NewFunction("rnd", &FParser::SF_Rnd);	// Legacy uses a normal rand() call for this which is extremely dangerous.
	gscr->NewFunction("prnd", &FParser::SF_Rnd);	// I am mapping rnd and prnd to the same named RNG which should eliminate any problem
	gscr->NewFunction("input", &FParser::SF_Input);
	gscr->NewFunction("beep", &FParser::SF_Beep);
	gscr->NewFunction("clock", &FParser::SF_Clock);
	gscr->NewFunction("wait", &FParser::SF_Wait);
	gscr->NewFunction("tagwait", &FParser::SF_TagWait);
	gscr->NewFunction("scriptwait", &FParser::SF_ScriptWait);
	gscr->NewFunction("startscript", &FParser::SF_StartScript);
	gscr->NewFunction("scriptrunning", &FParser::SF_ScriptRunning);
	
	// doom stuff
	gscr->NewFunction("startskill", &FParser::SF_StartSkill);
	gscr->NewFunction("exitlevel", &FParser::SF_ExitLevel);
	gscr->NewFunction("tip", &FParser::SF_Tip);
	gscr->NewFunction("timedtip", &FParser::SF_TimedTip);
	gscr->NewFunction("message", &FParser::SF_Message);
	gscr->NewFunction("gameskill", &FParser::SF_Gameskill);
	gscr->NewFunction("gamemode", &FParser::SF_Gamemode);
	
	// player stuff
	gscr->NewFunction("playermsg", &FParser::SF_PlayerMsg);
	gscr->NewFunction("playertip", &FParser::SF_PlayerTip);
	gscr->NewFunction("playeringame", &FParser::SF_PlayerInGame);
	gscr->NewFunction("playername", &FParser::SF_PlayerName);
	gscr->NewFunction("playeraddfrag", &FParser::SF_PlayerAddFrag);
	gscr->NewFunction("playerobj", &FParser::SF_PlayerObj);
	gscr->NewFunction("isplayerobj", &FParser::SF_IsPlayerObj);
	gscr->NewFunction("isobjplayer", &FParser::SF_IsPlayerObj);
	gscr->NewFunction("skincolor", &FParser::SF_SkinColor);
	gscr->NewFunction("playerkeys", &FParser::SF_PlayerKeys);
	gscr->NewFunction("playerammo", &FParser::SF_PlayerAmmo);
	gscr->NewFunction("maxplayerammo", &FParser::SF_MaxPlayerAmmo); 
	gscr->NewFunction("playerweapon", &FParser::SF_PlayerWeapon);
	gscr->NewFunction("playerselwep", &FParser::SF_PlayerSelectedWeapon);
	
	// mobj stuff
	gscr->NewFunction("spawn", &FParser::SF_Spawn);
	gscr->NewFunction("spawnexplosion", &FParser::SF_SpawnExplosion);
	gscr->NewFunction("radiusattack", &FParser::SF_RadiusAttack);
	gscr->NewFunction("kill", &FParser::SF_KillObj);
	gscr->NewFunction("removeobj", &FParser::SF_RemoveObj);
	gscr->NewFunction("objx", &FParser::SF_ObjX);
	gscr->NewFunction("objy", &FParser::SF_ObjY);
	gscr->NewFunction("objz", &FParser::SF_ObjZ);
	gscr->NewFunction("testlocation", &FParser::SF_TestLocation);
	gscr->NewFunction("teleport", &FParser::SF_Teleport);
	gscr->NewFunction("silentteleport", &FParser::SF_SilentTeleport);
	gscr->NewFunction("damageobj", &FParser::SF_DamageObj);
	gscr->NewFunction("healobj", &FParser::SF_HealObj);
	gscr->NewFunction("player", &FParser::SF_Player);
	gscr->NewFunction("objsector", &FParser::SF_ObjSector);
	gscr->NewFunction("objflag", &FParser::SF_ObjFlag);
	gscr->NewFunction("pushobj", &FParser::SF_PushThing);
	gscr->NewFunction("pushthing", &FParser::SF_PushThing);
	gscr->NewFunction("objangle", &FParser::SF_ObjAngle);
	gscr->NewFunction("objhealth", &FParser::SF_ObjHealth);
	gscr->NewFunction("objdead", &FParser::SF_ObjDead);
	gscr->NewFunction("reactiontime", &FParser::SF_ReactionTime);
	gscr->NewFunction("objreactiontime", &FParser::SF_ReactionTime);
	gscr->NewFunction("objtarget", &FParser::SF_MobjTarget);
	gscr->NewFunction("objmomx", &FParser::SF_MobjMomx);
	gscr->NewFunction("objmomy", &FParser::SF_MobjMomy);
	gscr->NewFunction("objmomz", &FParser::SF_MobjMomz);

	gscr->NewFunction("spawnmissile", &FParser::SF_SpawnMissile);
	gscr->NewFunction("mapthings", &FParser::SF_MapThings);
	gscr->NewFunction("objtype", &FParser::SF_ObjType);
	gscr->NewFunction("mapthingnumexist", &FParser::SF_MapThingNumExist);
	gscr->NewFunction("objstate", &FParser::SF_ObjState);
	gscr->NewFunction("resurrect", &FParser::SF_Resurrect);
	gscr->NewFunction("lineattack", &FParser::SF_LineAttack);
	gscr->NewFunction("setobjposition", &FParser::SF_SetObjPosition);

	// sector stuff
	gscr->NewFunction("floorheight", &FParser::SF_FloorHeight);
	gscr->NewFunction("floortext", &FParser::SF_FloorTexture);
	gscr->NewFunction("floortexture", &FParser::SF_FloorTexture);   // haleyjd: alias
	gscr->NewFunction("movefloor", &FParser::SF_MoveFloor);
	gscr->NewFunction("ceilheight", &FParser::SF_CeilingHeight);
	gscr->NewFunction("ceilingheight", &FParser::SF_CeilingHeight); // haleyjd: alias
	gscr->NewFunction("moveceil", &FParser::SF_MoveCeiling);
	gscr->NewFunction("moveceiling", &FParser::SF_MoveCeiling);     // haleyjd: aliases
	gscr->NewFunction("ceilingtexture", &FParser::SF_CeilingTexture);
	gscr->NewFunction("ceiltext", &FParser::SF_CeilingTexture);  // haleyjd: wrong
	gscr->NewFunction("lightlevel", &FParser::SF_LightLevel);    // handler - was
	gscr->NewFunction("fadelight", &FParser::SF_FadeLight);      // &FParser::SF_FloorTexture!
	gscr->NewFunction("colormap", &FParser::SF_SectorColormap);
	
	// cameras!
	gscr->NewFunction("setcamera", &FParser::SF_SetCamera);
	gscr->NewFunction("clearcamera", &FParser::SF_ClearCamera);
	gscr->NewFunction("movecamera", &FParser::SF_MoveCamera);
	
	// trig functions
	gscr->NewFunction("pointtoangle", &FParser::SF_PointToAngle);
	gscr->NewFunction("pointtodist", &FParser::SF_PointToDist);
	
	// sound functions
	gscr->NewFunction("startsound", &FParser::SF_StartSound);
	gscr->NewFunction("startsectorsound", &FParser::SF_StartSectorSound);
	gscr->NewFunction("ambientsound", &FParser::SF_AmbientSound);
	gscr->NewFunction("startambiantsound", &FParser::SF_AmbientSound);	// Legacy's incorrectly spelled name!
	gscr->NewFunction("changemusic", &FParser::SF_ChangeMusic);
	
	// hubs!
	gscr->NewFunction("changehublevel", &FParser::SF_ChangeHubLevel);
	
	// doors
	gscr->NewFunction("opendoor", &FParser::SF_OpenDoor);
	gscr->NewFunction("closedoor", &FParser::SF_CloseDoor);

	// HU Graphics
	gscr->NewFunction("newhupic", &FParser::SF_NewHUPic);
	gscr->NewFunction("createpic", &FParser::SF_NewHUPic);
	gscr->NewFunction("deletehupic", &FParser::SF_DeleteHUPic);
	gscr->NewFunction("modifyhupic", &FParser::SF_ModifyHUPic);
	gscr->NewFunction("modifypic", &FParser::SF_ModifyHUPic);
	gscr->NewFunction("sethupicdisplay", &FParser::SF_SetHUPicDisplay);
	gscr->NewFunction("setpicvisible", &FParser::SF_SetHUPicDisplay);

	//
	gscr->NewFunction("playdemo", &FParser::SF_PlayDemo);
	gscr->NewFunction("runcommand", &FParser::SF_RunCommand);
	gscr->NewFunction("checkcvar", &FParser::SF_CheckCVar);
	gscr->NewFunction("setlinetexture", &FParser::SF_SetLineTexture);
	gscr->NewFunction("linetrigger", &FParser::SF_LineTrigger);
	gscr->NewFunction("lineflag", &FParser::SF_LineFlag);

	//Hurdler: new math functions
	gscr->NewFunction("max", &FParser::SF_Max);
	gscr->NewFunction("min", &FParser::SF_Min);
	gscr->NewFunction("abs", &FParser::SF_Abs);

	gscr->NewFunction("sin", &FParser::SF_Sin);
	gscr->NewFunction("asin", &FParser::SF_ASin);
	gscr->NewFunction("cos", &FParser::SF_Cos);
	gscr->NewFunction("acos", &FParser::SF_ACos);
	gscr->NewFunction("tan", &FParser::SF_Tan);
	gscr->NewFunction("atan", &FParser::SF_ATan);
	gscr->NewFunction("exp", &FParser::SF_Exp);
	gscr->NewFunction("log", &FParser::SF_Log);
	gscr->NewFunction("sqrt", &FParser::SF_Sqrt);
	gscr->NewFunction("floor", &FParser::SF_Floor);
	gscr->NewFunction("pow", &FParser::SF_Pow);
	
	// Eternity extensions
	gscr->NewFunction("setlineblocking", &FParser::SF_SetLineBlocking);
	gscr->NewFunction("setlinetrigger", &FParser::SF_SetLineTrigger);
	gscr->NewFunction("setlinemnblock", &FParser::SF_SetLineMonsterBlocking);
	gscr->NewFunction("scriptwaitpre", &FParser::SF_ScriptWaitPre);
	gscr->NewFunction("exitsecret", &FParser::SF_ExitSecret);
	gscr->NewFunction("objawaken", &FParser::SF_ObjAwaken);
	
	// forced coercion functions
	gscr->NewFunction("mobjvalue", &FParser::SF_MobjValue);
	gscr->NewFunction("stringvalue", &FParser::SF_StringValue);
	gscr->NewFunction("intvalue", &FParser::SF_IntValue);
	gscr->NewFunction("fixedvalue", &FParser::SF_FixedValue);

	// new for GZDoom
	gscr->NewFunction("spawnshot2", &FParser::SF_SpawnShot2);
	gscr->NewFunction("setcolor", &FParser::SF_SetColor);
	gscr->NewFunction("objradius", &FParser::SF_MobjRadius);
	gscr->NewFunction("objheight", &FParser::SF_MobjHeight);
	gscr->NewFunction("thingcount", &FParser::SF_ThingCount);
	gscr->NewFunction("killinsector", &FParser::SF_KillInSector);
	gscr->NewFunction("levelnum", &FParser::SF_LevelNum);

	// new inventory
	gscr->NewFunction("giveinventory", &FParser::SF_GiveInventory);
	gscr->NewFunction("takeinventory", &FParser::SF_TakeInventory);
	gscr->NewFunction("checkinventory", &FParser::SF_CheckInventory);
	gscr->NewFunction("setweapon", &FParser::SF_SetWeapon);

	// Dummies - shut up warnings
	gscr->NewFunction("setcorona", &FParser::SF_SetCorona);
}